

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
EnrichableSpiSimulationDataGenerator::OutputWord_CPHA1
          (EnrichableSpiSimulationDataGenerator *this,U64 mosi_data,U64 miso_data)

{
  uint uVar1;
  SimulationChannelDescriptor *pSVar2;
  int iVar3;
  uint local_44;
  U32 i;
  U32 count;
  BitExtractor local_30 [8];
  BitExtractor miso_bits;
  BitExtractor mosi_bits;
  U64 miso_data_local;
  U64 mosi_data_local;
  EnrichableSpiSimulationDataGenerator *this_local;
  
  BitExtractor::BitExtractor
            (&miso_bits,mosi_data,this->mSettings->mShiftOrder,this->mSettings->mBitsPerTransfer);
  BitExtractor::BitExtractor
            (local_30,miso_data,this->mSettings->mShiftOrder,this->mSettings->mBitsPerTransfer);
  uVar1 = this->mSettings->mBitsPerTransfer;
  for (local_44 = 0; iVar3 = (int)this, local_44 < uVar1; local_44 = local_44 + 1) {
    SimulationChannelDescriptor::Transition();
    if (this->mMosi != (SimulationChannelDescriptor *)0x0) {
      pSVar2 = this->mMosi;
      BitExtractor::GetNextBit();
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar2);
    }
    if (this->mMiso != (SimulationChannelDescriptor *)0x0) {
      pSVar2 = this->mMiso;
      BitExtractor::GetNextBit();
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar2);
    }
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar3 + 0x20);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll(iVar3 + 0x20);
  }
  if (this->mMosi != (SimulationChannelDescriptor *)0x0) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMosi);
  }
  if (this->mMiso != (SimulationChannelDescriptor *)0x0) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMiso);
  }
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar3 + 0x20);
  BitExtractor::~BitExtractor(local_30);
  BitExtractor::~BitExtractor(&miso_bits);
  return;
}

Assistant:

void EnrichableSpiSimulationDataGenerator::OutputWord_CPHA1( U64 mosi_data, U64 miso_data )
{
	BitExtractor mosi_bits( mosi_data, mSettings->mShiftOrder, mSettings->mBitsPerTransfer );
	BitExtractor miso_bits( miso_data, mSettings->mShiftOrder, mSettings->mBitsPerTransfer );

	U32 count = mSettings->mBitsPerTransfer;
	for( U32 i=0; i<count; i++ )
	{
		mClock->Transition();  //data invalid
		if( mMosi != NULL )
			mMosi->TransitionIfNeeded( mosi_bits.GetNextBit() );
		if( mMiso != NULL )
			mMiso->TransitionIfNeeded( miso_bits.GetNextBit() );

		mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( .5 ) );
		mClock->Transition();  //data valid

		mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( .5 ) );
	}

	if( mMosi != NULL )
		mMosi->TransitionIfNeeded( BIT_LOW );
	if( mMiso != NULL )
		mMiso->TransitionIfNeeded( BIT_LOW );

	mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) );
}